

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGame.cpp
# Opt level: O0

void __thiscall BayesianGame::Print(BayesianGame *this)

{
  ostream *poVar1;
  long in_RDI;
  Index aI;
  BayesianGameBase *in_stack_00000020;
  uint local_c;
  
  BayesianGameBase::Print(in_stack_00000020);
  poVar1 = std::operator<<((ostream *)&std::cout,"Utility functions:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_c = 0; (ulong)local_c < *(ulong *)(in_RDI + 0x78); local_c = local_c + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Agent ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_c);
    poVar1 = std::operator<<(poVar1,":");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::vector<RewardModelMapping,_std::allocator<RewardModelMapping>_>::operator[]
              ((vector<RewardModelMapping,_std::allocator<RewardModelMapping>_> *)(in_RDI + 0xe0),
               (ulong)local_c);
    RewardModelDiscreteInterface::Print((RewardModelDiscreteInterface *)in_stack_00000020);
  }
  return;
}

Assistant:

void BayesianGame::Print() const
{
    BayesianGameBase::Print();
    
    cout << "Utility functions:"<<endl;
    for(Index aI = 0; aI < _m_nrAgents; aI++)
    {
        cout << "Agent "<<aI<<":"<<endl;
        _m_utilFuncs[aI].Print();
    }
}